

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.cpp
# Opt level: O3

void anon_unknown.dwarf_29a0d3::sha256::Transform(uint32_t *s,uchar *chunk,size_t blocks)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint32_t uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  uint uVar42;
  uint uVar43;
  uint uVar44;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  uint32_t uVar50;
  uint uVar51;
  uint uVar52;
  uint uVar53;
  uint uVar54;
  uint uVar55;
  uint uVar56;
  uint uVar57;
  uint uVar58;
  uint uVar59;
  uint uVar60;
  uint uVar61;
  uint uVar62;
  uint uVar63;
  uint uVar64;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (blocks != 0) {
    uVar54 = *s;
    uVar9 = s[1];
    uVar26 = s[2];
    uVar50 = s[3];
    uVar24 = s[4];
    uVar44 = s[5];
    uVar16 = s[6];
    uVar35 = s[7];
    do {
      uVar6 = *(uint *)chunk;
      uVar38 = *(uint *)((long)chunk + 4);
      uVar3 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
      uVar6 = (uVar16 ^ uVar44) & uVar24 ^ uVar16;
      iVar4 = ((uVar24 << 7 | uVar24 >> 0x19) ^
              (uVar24 << 0x15 | uVar24 >> 0xb) ^ (uVar24 << 0x1a | uVar24 >> 6)) + uVar35 + uVar3;
      uVar5 = ((uVar9 | uVar54) & uVar26 | uVar9 & uVar54) +
              ((uVar54 << 10 | uVar54 >> 0x16) ^
              (uVar54 << 0x13 | uVar54 >> 0xd) ^ (uVar54 << 0x1e | uVar54 >> 2)) +
              uVar6 + iVar4 + 0x428a2f98;
      uVar27 = iVar4 + uVar6 + uVar50 + 0x428a2f98;
      uVar15 = uVar38 >> 0x18 | (uVar38 & 0xff0000) >> 8 | (uVar38 & 0xff00) << 8;
      uVar57 = uVar15 | uVar38 << 0x18;
      uVar6 = (uVar27 * 0x80 | uVar27 >> 0x19) ^
              (uVar27 * 0x200000 | uVar27 >> 0xb) ^ (uVar27 * 0x4000000 | uVar27 >> 6);
      iVar4 = ((uVar44 ^ uVar24) & uVar27 ^ uVar44) + uVar16 + uVar57;
      uVar39 = iVar4 + uVar6 + uVar26 + 0x71374491;
      uVar7 = ((uVar5 | uVar54) & uVar9 | uVar5 & uVar54) +
              ((uVar5 * 0x400 | uVar5 >> 0x16) ^
              (uVar5 * 0x80000 | uVar5 >> 0xd) ^ (uVar5 * 0x40000000 | uVar5 >> 2)) +
              iVar4 + uVar6 + 0x71374491;
      uVar10 = (uVar39 * 0x80 | uVar39 >> 0x19) ^
               (uVar39 * 0x200000 | uVar39 >> 0xb) ^ (uVar39 * 0x4000000 | uVar39 >> 6);
      uVar6 = *(uint *)((long)chunk + 8);
      uVar25 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8;
      uVar36 = uVar25 | uVar6 << 0x18;
      iVar4 = ((uVar27 ^ uVar24) & uVar39 ^ uVar24) + uVar36 + uVar44;
      uVar11 = ((uVar7 | uVar5) & uVar54 | uVar7 & uVar5) +
               ((uVar7 * 0x400 | uVar7 >> 0x16) ^
               (uVar7 * 0x80000 | uVar7 >> 0xd) ^ (uVar7 * 0x40000000 | uVar7 >> 2)) +
               iVar4 + uVar10 + -0x4a3f0431;
      uVar45 = uVar9 + iVar4 + uVar10 + 0xb5c0fbcf;
      uVar29 = (uVar45 * 0x80 | uVar45 >> 0x19) ^
               (uVar45 * 0x200000 | uVar45 >> 0xb) ^ (uVar45 * 0x4000000 | uVar45 >> 6);
      uVar10 = *(uint *)((long)chunk + 0xc);
      uVar34 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8;
      uVar51 = uVar34 | uVar10 << 0x18;
      iVar4 = ((uVar39 ^ uVar27) & uVar45 ^ uVar27) + uVar51 + uVar24;
      uVar30 = ((uVar11 | uVar7) & uVar5 | uVar11 & uVar7) +
               ((uVar11 * 0x400 | uVar11 >> 0x16) ^
               (uVar11 * 0x80000 | uVar11 >> 0xd) ^ (uVar11 * 0x40000000 | uVar11 >> 2)) +
               iVar4 + uVar29 + -0x164a245b;
      uVar52 = iVar4 + uVar29 + uVar54 + 0xe9b5dba5;
      uVar29 = *(uint *)((long)chunk + 0x10);
      uVar42 = uVar29 >> 0x18 | (uVar29 & 0xff0000) >> 8 | (uVar29 & 0xff00) << 8;
      uVar17 = uVar42 | uVar29 << 0x18;
      iVar4 = ((uVar52 * 0x80 | uVar52 >> 0x19) ^
              (uVar52 * 0x200000 | uVar52 >> 0xb) ^ (uVar52 * 0x4000000 | uVar52 >> 6)) +
              ((uVar45 ^ uVar39) & uVar52 ^ uVar39) + uVar27 + uVar17 + 0x3956c25b;
      uVar5 = uVar5 + iVar4;
      uVar37 = ((uVar30 | uVar11) & uVar7 | uVar30 & uVar11) +
               ((uVar30 * 0x400 | uVar30 >> 0x16) ^
               (uVar30 * 0x80000 | uVar30 >> 0xd) ^ (uVar30 * 0x40000000 | uVar30 >> 2)) + iVar4;
      uVar27 = *(uint *)((long)chunk + 0x14);
      uVar43 = uVar27 >> 0x18 | (uVar27 & 0xff0000) >> 8 | (uVar27 & 0xff00) << 8;
      uVar18 = uVar43 | uVar27 << 0x18;
      iVar4 = ((uVar5 * 0x80 | uVar5 >> 0x19) ^
              (uVar5 * 0x200000 | uVar5 >> 0xb) ^ (uVar5 * 0x4000000 | uVar5 >> 6)) +
              ((uVar52 ^ uVar45) & uVar5 ^ uVar45) + uVar39 + uVar18 + 0x59f111f1;
      uVar7 = uVar7 + iVar4;
      uVar40 = ((uVar37 | uVar30) & uVar11 | uVar37 & uVar30) +
               ((uVar37 * 0x400 | uVar37 >> 0x16) ^
               (uVar37 * 0x80000 | uVar37 >> 0xd) ^ (uVar37 * 0x40000000 | uVar37 >> 2)) + iVar4;
      uVar39 = *(uint *)((long)chunk + 0x18);
      uVar47 = uVar39 >> 0x18 | (uVar39 & 0xff0000) >> 8 | (uVar39 & 0xff00) << 8;
      uVar19 = uVar47 | uVar39 << 0x18;
      iVar4 = ((uVar7 * 0x80 | uVar7 >> 0x19) ^
              (uVar7 * 0x200000 | uVar7 >> 0xb) ^ (uVar7 * 0x4000000 | uVar7 >> 6)) +
              ((uVar5 ^ uVar52) & uVar7 ^ uVar52) + uVar45 + uVar19 + -0x6dc07d5c;
      uVar11 = uVar11 + iVar4;
      uVar46 = ((uVar40 | uVar37) & uVar30 | uVar40 & uVar37) +
               ((uVar40 * 0x400 | uVar40 >> 0x16) ^
               (uVar40 * 0x80000 | uVar40 >> 0xd) ^ (uVar40 * 0x40000000 | uVar40 >> 2)) + iVar4;
      uVar45 = *(uint *)((long)chunk + 0x1c);
      uVar48 = uVar45 >> 0x18 | (uVar45 & 0xff0000) >> 8 | (uVar45 & 0xff00) << 8;
      uVar20 = uVar48 | uVar45 << 0x18;
      iVar4 = ((uVar11 * 0x80 | uVar11 >> 0x19) ^
              (uVar11 * 0x200000 | uVar11 >> 0xb) ^ (uVar11 * 0x4000000 | uVar11 >> 6)) +
              ((uVar7 ^ uVar5) & uVar11 ^ uVar5) + uVar52 + uVar20 + -0x54e3a12b;
      uVar30 = uVar30 + iVar4;
      uVar53 = ((uVar46 | uVar40) & uVar37 | uVar46 & uVar40) +
               ((uVar46 * 0x400 | uVar46 >> 0x16) ^
               (uVar46 * 0x80000 | uVar46 >> 0xd) ^ (uVar46 * 0x40000000 | uVar46 >> 2)) + iVar4;
      uVar52 = *(uint *)((long)chunk + 0x20);
      uVar49 = uVar52 >> 0x18 | (uVar52 & 0xff0000) >> 8 | (uVar52 & 0xff00) << 8;
      uVar21 = uVar49 | uVar52 << 0x18;
      iVar4 = ((uVar30 * 0x80 | uVar30 >> 0x19) ^
              (uVar30 * 0x200000 | uVar30 >> 0xb) ^ (uVar30 * 0x4000000 | uVar30 >> 6)) +
              ((uVar11 ^ uVar7) & uVar30 ^ uVar7) + uVar5 + uVar21 + -0x27f85568;
      uVar37 = uVar37 + iVar4;
      uVar28 = ((uVar53 | uVar46) & uVar40 | uVar53 & uVar46) +
               ((uVar53 * 0x400 | uVar53 >> 0x16) ^
               (uVar53 * 0x80000 | uVar53 >> 0xd) ^ (uVar53 * 0x40000000 | uVar53 >> 2)) + iVar4;
      uVar5 = *(uint *)((long)chunk + 0x24);
      uVar55 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8;
      uVar22 = uVar55 | uVar5 << 0x18;
      iVar4 = ((uVar37 * 0x80 | uVar37 >> 0x19) ^
              (uVar37 * 0x200000 | uVar37 >> 0xb) ^ (uVar37 * 0x4000000 | uVar37 >> 6)) +
              ((uVar30 ^ uVar11) & uVar37 ^ uVar11) + uVar7 + uVar22 + 0x12835b01;
      uVar40 = uVar40 + iVar4;
      uVar8 = ((uVar28 | uVar53) & uVar46 | uVar28 & uVar53) +
              ((uVar28 * 0x400 | uVar28 >> 0x16) ^
              (uVar28 * 0x80000 | uVar28 >> 0xd) ^ (uVar28 * 0x40000000 | uVar28 >> 2)) + iVar4;
      uVar7 = *(uint *)((long)chunk + 0x28);
      uVar56 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8;
      uVar23 = uVar56 | uVar7 << 0x18;
      iVar4 = ((uVar40 * 0x80 | uVar40 >> 0x19) ^
              (uVar40 * 0x200000 | uVar40 >> 0xb) ^ (uVar40 * 0x4000000 | uVar40 >> 6)) +
              ((uVar37 ^ uVar30) & uVar40 ^ uVar30) + uVar11 + uVar23 + 0x243185be;
      uVar46 = uVar46 + iVar4;
      uVar60 = ((uVar8 | uVar28) & uVar53 | uVar8 & uVar28) +
               ((uVar8 * 0x400 | uVar8 >> 0x16) ^
               (uVar8 * 0x80000 | uVar8 >> 0xd) ^ (uVar8 * 0x40000000 | uVar8 >> 2)) + iVar4;
      uVar11 = *(uint *)((long)chunk + 0x2c);
      uVar59 = uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8;
      uVar12 = uVar59 | uVar11 << 0x18;
      iVar4 = ((uVar46 * 0x80 | uVar46 >> 0x19) ^
              (uVar46 * 0x200000 | uVar46 >> 0xb) ^ (uVar46 * 0x4000000 | uVar46 >> 6)) +
              ((uVar40 ^ uVar37) & uVar46 ^ uVar37) + uVar30 + uVar12 + 0x550c7dc3;
      uVar53 = uVar53 + iVar4;
      uVar31 = ((uVar60 | uVar8) & uVar28 | uVar60 & uVar8) +
               ((uVar60 * 0x400 | uVar60 >> 0x16) ^
               (uVar60 * 0x80000 | uVar60 >> 0xd) ^ (uVar60 * 0x40000000 | uVar60 >> 2)) + iVar4;
      uVar30 = *(uint *)((long)chunk + 0x30);
      uVar61 = uVar30 >> 0x18 | (uVar30 & 0xff0000) >> 8 | (uVar30 & 0xff00) << 8;
      uVar13 = uVar61 | uVar30 << 0x18;
      iVar4 = ((uVar53 * 0x80 | uVar53 >> 0x19) ^
              (uVar53 * 0x200000 | uVar53 >> 0xb) ^ (uVar53 * 0x4000000 | uVar53 >> 6)) +
              ((uVar46 ^ uVar40) & uVar53 ^ uVar40) + uVar37 + uVar13 + 0x72be5d74;
      uVar28 = uVar28 + iVar4;
      uVar32 = ((uVar31 | uVar60) & uVar8 | uVar31 & uVar60) +
               ((uVar31 * 0x400 | uVar31 >> 0x16) ^
               (uVar31 * 0x80000 | uVar31 >> 0xd) ^ (uVar31 * 0x40000000 | uVar31 >> 2)) + iVar4;
      uVar37 = *(uint *)((long)chunk + 0x34);
      uVar63 = uVar37 >> 0x18 | (uVar37 & 0xff0000) >> 8 | (uVar37 & 0xff00) << 8;
      uVar14 = uVar63 | uVar37 << 0x18;
      iVar4 = ((uVar28 * 0x80 | uVar28 >> 0x19) ^
              (uVar28 * 0x200000 | uVar28 >> 0xb) ^ (uVar28 * 0x4000000 | uVar28 >> 6)) +
              ((uVar53 ^ uVar46) & uVar28 ^ uVar46) + uVar40 + uVar14 + -0x7f214e02;
      uVar8 = uVar8 + iVar4;
      uVar33 = ((uVar32 | uVar31) & uVar60 | uVar32 & uVar31) +
               ((uVar32 * 0x400 | uVar32 >> 0x16) ^
               (uVar32 * 0x80000 | uVar32 >> 0xd) ^ (uVar32 * 0x40000000 | uVar32 >> 2)) + iVar4;
      uVar40 = *(uint *)((long)chunk + 0x38);
      uVar64 = uVar40 >> 0x18 | (uVar40 & 0xff0000) >> 8 | (uVar40 & 0xff00) << 8;
      uVar62 = uVar64 | uVar40 << 0x18;
      iVar4 = ((uVar8 * 0x80 | uVar8 >> 0x19) ^
              (uVar8 * 0x200000 | uVar8 >> 0xb) ^ (uVar8 * 0x4000000 | uVar8 >> 6)) +
              ((uVar28 ^ uVar53) & uVar8 ^ uVar53) + uVar46 + uVar62 + -0x6423f959;
      uVar60 = uVar60 + iVar4;
      uVar58 = ((uVar33 | uVar32) & uVar31 | uVar33 & uVar32) +
               ((uVar33 * 0x400 | uVar33 >> 0x16) ^
               (uVar33 * 0x80000 | uVar33 >> 0xd) ^ (uVar33 * 0x40000000 | uVar33 >> 2)) + iVar4;
      uVar46 = *(uint *)((long)chunk + 0x3c);
      uVar2 = uVar46 >> 0x18 | (uVar46 & 0xff0000) >> 8 | (uVar46 & 0xff00) << 8;
      uVar41 = uVar2 | uVar46 << 0x18;
      iVar4 = ((uVar60 * 0x80 | uVar60 >> 0x19) ^
              (uVar60 * 0x200000 | uVar60 >> 0xb) ^ (uVar60 * 0x4000000 | uVar60 >> 6)) +
              ((uVar8 ^ uVar28) & uVar60 ^ uVar28) + uVar53 + uVar41 + -0x3e640e8c;
      uVar31 = uVar31 + iVar4;
      uVar53 = ((uVar58 | uVar33) & uVar32 | uVar58 & uVar33) +
               ((uVar58 * 0x400 | uVar58 >> 0x16) ^
               (uVar58 * 0x80000 | uVar58 >> 0xd) ^ (uVar58 * 0x40000000 | uVar58 >> 2)) + iVar4;
      uVar15 = uVar3 + uVar22 +
               (uVar57 >> 3 ^
               (uVar15 << 0xe | uVar57 >> 0x12) ^ ((uVar38 >> 0x18) << 0x19 | uVar57 >> 7)) +
               (uVar62 >> 10 ^ (uVar64 << 0xd | uVar62 >> 0x13) ^ (uVar64 << 0xf | uVar62 >> 0x11));
      iVar4 = ((uVar31 * 0x80 | uVar31 >> 0x19) ^
              (uVar31 * 0x200000 | uVar31 >> 0xb) ^ (uVar31 * 0x4000000 | uVar31 >> 6)) +
              ((uVar60 ^ uVar8) & uVar31 ^ uVar8) + uVar28 + uVar15 + -0x1b64963f;
      uVar32 = uVar32 + iVar4;
      uVar28 = ((uVar53 | uVar58) & uVar33 | uVar53 & uVar58) +
               ((uVar53 * 0x400 | uVar53 >> 0x16) ^
               (uVar53 * 0x80000 | uVar53 >> 0xd) ^ (uVar53 * 0x40000000 | uVar53 >> 2)) + iVar4;
      uVar57 = uVar57 + uVar23 +
               (uVar36 >> 3 ^
               (uVar25 << 0xe | uVar36 >> 0x12) ^ ((uVar6 >> 0x18) << 0x19 | uVar36 >> 7)) +
               (uVar41 >> 10 ^ (uVar2 << 0xd | uVar41 >> 0x13) ^ (uVar2 << 0xf | uVar41 >> 0x11));
      iVar4 = ((uVar32 * 0x80 | uVar32 >> 0x19) ^
              (uVar32 * 0x200000 | uVar32 >> 0xb) ^ (uVar32 * 0x4000000 | uVar32 >> 6)) +
              ((uVar31 ^ uVar60) & uVar32 ^ uVar60) + uVar8 + uVar57 + -0x1041b87a;
      uVar33 = uVar33 + iVar4;
      uVar38 = ((uVar28 | uVar53) & uVar58 | uVar28 & uVar53) +
               ((uVar28 * 0x400 | uVar28 >> 0x16) ^
               (uVar28 * 0x80000 | uVar28 >> 0xd) ^ (uVar28 * 0x40000000 | uVar28 >> 2)) + iVar4;
      uVar3 = uVar36 + uVar12 +
              (uVar51 >> 3 ^
              (uVar34 << 0xe | uVar51 >> 0x12) ^ ((uVar10 >> 0x18) << 0x19 | uVar51 >> 7)) +
              (uVar15 >> 10 ^
              (uVar15 * 0x2000 | uVar15 >> 0x13) ^ (uVar15 * 0x8000 | uVar15 >> 0x11));
      iVar4 = ((uVar32 ^ uVar31) & uVar33 ^ uVar31) + uVar60 + uVar3 +
              ((uVar33 * 0x80 | uVar33 >> 0x19) ^
              (uVar33 * 0x200000 | uVar33 >> 0xb) ^ (uVar33 * 0x4000000 | uVar33 >> 6)) + 0xfc19dc6;
      uVar58 = uVar58 + iVar4;
      uVar25 = ((uVar38 | uVar28) & uVar53 | uVar38 & uVar28) +
               ((uVar38 * 0x400 | uVar38 >> 0x16) ^
               (uVar38 * 0x80000 | uVar38 >> 0xd) ^ (uVar38 * 0x40000000 | uVar38 >> 2)) + iVar4;
      uVar42 = uVar51 + uVar13 +
               (uVar17 >> 3 ^
               (uVar42 << 0xe | uVar17 >> 0x12) ^ ((uVar29 >> 0x18) << 0x19 | uVar17 >> 7)) +
               (uVar57 >> 10 ^
               (uVar57 * 0x2000 | uVar57 >> 0x13) ^ (uVar57 * 0x8000 | uVar57 >> 0x11));
      iVar4 = ((uVar58 * 0x80 | uVar58 >> 0x19) ^
              (uVar58 * 0x200000 | uVar58 >> 0xb) ^ (uVar58 * 0x4000000 | uVar58 >> 6)) +
              ((uVar33 ^ uVar32) & uVar58 ^ uVar32) + uVar31 + uVar42 + 0x240ca1cc;
      uVar53 = uVar53 + iVar4;
      uVar8 = ((uVar25 | uVar38) & uVar28 | uVar25 & uVar38) +
              ((uVar25 * 0x400 | uVar25 >> 0x16) ^
              (uVar25 * 0x80000 | uVar25 >> 0xd) ^ (uVar25 * 0x40000000 | uVar25 >> 2)) + iVar4;
      uVar31 = uVar17 + uVar14 +
               (uVar18 >> 3 ^
               (uVar43 << 0xe | uVar18 >> 0x12) ^ ((uVar27 >> 0x18) << 0x19 | uVar18 >> 7)) +
               (uVar3 >> 10 ^ (uVar3 * 0x2000 | uVar3 >> 0x13) ^ (uVar3 * 0x8000 | uVar3 >> 0x11));
      iVar4 = ((uVar53 * 0x80 | uVar53 >> 0x19) ^
              (uVar53 * 0x200000 | uVar53 >> 0xb) ^ (uVar53 * 0x4000000 | uVar53 >> 6)) +
              ((uVar58 ^ uVar33) & uVar53 ^ uVar33) + uVar32 + uVar31 + 0x2de92c6f;
      uVar28 = uVar28 + iVar4;
      uVar34 = ((uVar8 | uVar25) & uVar38 | uVar8 & uVar25) +
               ((uVar8 * 0x400 | uVar8 >> 0x16) ^
               (uVar8 * 0x80000 | uVar8 >> 0xd) ^ (uVar8 * 0x40000000 | uVar8 >> 2)) + iVar4;
      uVar43 = uVar18 + uVar62 +
               (uVar19 >> 3 ^
               (uVar47 << 0xe | uVar19 >> 0x12) ^ ((uVar39 >> 0x18) << 0x19 | uVar19 >> 7)) +
               (uVar42 >> 10 ^
               (uVar42 * 0x2000 | uVar42 >> 0x13) ^ (uVar42 * 0x8000 | uVar42 >> 0x11));
      iVar4 = ((uVar28 * 0x80 | uVar28 >> 0x19) ^
              (uVar28 * 0x200000 | uVar28 >> 0xb) ^ (uVar28 * 0x4000000 | uVar28 >> 6)) +
              ((uVar53 ^ uVar58) & uVar28 ^ uVar58) + uVar33 + uVar43 + 0x4a7484aa;
      uVar38 = uVar38 + iVar4;
      uVar33 = ((uVar34 | uVar8) & uVar25 | uVar34 & uVar8) +
               ((uVar34 * 0x400 | uVar34 >> 0x16) ^
               (uVar34 * 0x80000 | uVar34 >> 0xd) ^ (uVar34 * 0x40000000 | uVar34 >> 2)) + iVar4;
      uVar47 = uVar19 + uVar41 +
               (uVar20 >> 3 ^
               (uVar48 << 0xe | uVar20 >> 0x12) ^ ((uVar45 >> 0x18) << 0x19 | uVar20 >> 7)) +
               (uVar31 >> 10 ^
               (uVar31 * 0x2000 | uVar31 >> 0x13) ^ (uVar31 * 0x8000 | uVar31 >> 0x11));
      iVar4 = ((uVar38 * 0x80 | uVar38 >> 0x19) ^
              (uVar38 * 0x200000 | uVar38 >> 0xb) ^ (uVar38 * 0x4000000 | uVar38 >> 6)) +
              ((uVar28 ^ uVar53) & uVar38 ^ uVar53) + uVar58 + uVar47 + 0x5cb0a9dc;
      uVar25 = uVar25 + iVar4;
      uVar10 = ((uVar33 | uVar34) & uVar8 | uVar33 & uVar34) +
               ((uVar33 * 0x400 | uVar33 >> 0x16) ^
               (uVar33 * 0x80000 | uVar33 >> 0xd) ^ (uVar33 * 0x40000000 | uVar33 >> 2)) + iVar4;
      uVar17 = (uVar21 >> 3 ^
               (uVar49 << 0xe | uVar21 >> 0x12) ^ ((uVar52 >> 0x18) << 0x19 | uVar21 >> 7)) + uVar20
               + uVar15 +
               (uVar43 >> 10 ^
               (uVar43 * 0x2000 | uVar43 >> 0x13) ^ (uVar43 * 0x8000 | uVar43 >> 0x11));
      iVar4 = ((uVar38 ^ uVar28) & uVar25 ^ uVar28) + uVar53 + uVar17 +
              ((uVar25 * 0x80 | uVar25 >> 0x19) ^
              (uVar25 * 0x200000 | uVar25 >> 0xb) ^ (uVar25 * 0x4000000 | uVar25 >> 6)) + 0x76f988da
      ;
      uVar8 = uVar8 + iVar4;
      uVar6 = ((uVar10 | uVar33) & uVar34 | uVar10 & uVar33) +
              ((uVar10 * 0x400 | uVar10 >> 0x16) ^
              (uVar10 * 0x80000 | uVar10 >> 0xd) ^ (uVar10 * 0x40000000 | uVar10 >> 2)) + iVar4;
      uVar29 = (uVar22 >> 3 ^
               (uVar55 << 0xe | uVar22 >> 0x12) ^ ((uVar5 >> 0x18) << 0x19 | uVar22 >> 7)) + uVar21
               + uVar57 +
               (uVar47 >> 10 ^
               (uVar47 * 0x2000 | uVar47 >> 0x13) ^ (uVar47 * 0x8000 | uVar47 >> 0x11));
      iVar4 = ((uVar8 * 0x80 | uVar8 >> 0x19) ^
              (uVar8 * 0x200000 | uVar8 >> 0xb) ^ (uVar8 * 0x4000000 | uVar8 >> 6)) +
              ((uVar25 ^ uVar38) & uVar8 ^ uVar38) + uVar28 + uVar29 + -0x67c1aeae;
      uVar34 = uVar34 + iVar4;
      uVar5 = ((uVar6 | uVar10) & uVar33 | uVar6 & uVar10) +
              ((uVar6 * 0x400 | uVar6 >> 0x16) ^
              (uVar6 * 0x80000 | uVar6 >> 0xd) ^ (uVar6 * 0x40000000 | uVar6 >> 2)) + iVar4;
      uVar18 = (uVar23 >> 3 ^
               (uVar56 << 0xe | uVar23 >> 0x12) ^ ((uVar7 >> 0x18) << 0x19 | uVar23 >> 7)) + uVar22
               + uVar3 + (uVar17 >> 10 ^
                         (uVar17 * 0x2000 | uVar17 >> 0x13) ^ (uVar17 * 0x8000 | uVar17 >> 0x11));
      iVar4 = ((uVar8 ^ uVar25) & uVar34 ^ uVar25) + uVar38 + uVar18 +
              ((uVar34 * 0x80 | uVar34 >> 0x19) ^
              (uVar34 * 0x200000 | uVar34 >> 0xb) ^ (uVar34 * 0x4000000 | uVar34 >> 6)) +
              -0x57ce3993;
      uVar33 = uVar33 + iVar4;
      uVar38 = ((uVar5 | uVar6) & uVar10 | uVar5 & uVar6) +
               ((uVar5 * 0x400 | uVar5 >> 0x16) ^
               (uVar5 * 0x80000 | uVar5 >> 0xd) ^ (uVar5 * 0x40000000 | uVar5 >> 2)) + iVar4;
      uVar55 = (uVar12 >> 3 ^
               (uVar59 << 0xe | uVar12 >> 0x12) ^ ((uVar11 >> 0x18) << 0x19 | uVar12 >> 7)) + uVar23
               + uVar42 +
               (uVar29 >> 10 ^
               (uVar29 * 0x2000 | uVar29 >> 0x13) ^ (uVar29 * 0x8000 | uVar29 >> 0x11));
      iVar4 = ((uVar33 * 0x80 | uVar33 >> 0x19) ^
              (uVar33 * 0x200000 | uVar33 >> 0xb) ^ (uVar33 * 0x4000000 | uVar33 >> 6)) +
              ((uVar34 ^ uVar8) & uVar33 ^ uVar8) + uVar25 + uVar55 + -0x4ffcd838;
      uVar10 = uVar10 + iVar4;
      uVar7 = ((uVar38 | uVar5) & uVar6 | uVar38 & uVar5) +
              ((uVar38 * 0x400 | uVar38 >> 0x16) ^
              (uVar38 * 0x80000 | uVar38 >> 0xd) ^ (uVar38 * 0x40000000 | uVar38 >> 2)) + iVar4;
      uVar56 = (uVar13 >> 3 ^
               (uVar61 << 0xe | uVar13 >> 0x12) ^ ((uVar30 >> 0x18) << 0x19 | uVar13 >> 7)) + uVar12
               + uVar31 +
               (uVar18 >> 10 ^
               (uVar18 * 0x2000 | uVar18 >> 0x13) ^ (uVar18 * 0x8000 | uVar18 >> 0x11));
      iVar4 = ((uVar10 * 0x80 | uVar10 >> 0x19) ^
              (uVar10 * 0x200000 | uVar10 >> 0xb) ^ (uVar10 * 0x4000000 | uVar10 >> 6)) +
              ((uVar33 ^ uVar34) & uVar10 ^ uVar34) + uVar8 + uVar56 + -0x40a68039;
      uVar6 = uVar6 + iVar4;
      uVar27 = ((uVar7 | uVar38) & uVar5 | uVar7 & uVar38) +
               ((uVar7 * 0x400 | uVar7 >> 0x16) ^
               (uVar7 * 0x80000 | uVar7 >> 0xd) ^ (uVar7 * 0x40000000 | uVar7 >> 2)) + iVar4;
      uVar39 = (uVar14 >> 3 ^
               (uVar63 << 0xe | uVar14 >> 0x12) ^ ((uVar37 >> 0x18) << 0x19 | uVar14 >> 7)) + uVar13
               + uVar43 +
               (uVar55 >> 10 ^
               (uVar55 * 0x2000 | uVar55 >> 0x13) ^ (uVar55 * 0x8000 | uVar55 >> 0x11));
      iVar4 = ((uVar6 * 0x80 | uVar6 >> 0x19) ^
              (uVar6 * 0x200000 | uVar6 >> 0xb) ^ (uVar6 * 0x4000000 | uVar6 >> 6)) +
              ((uVar10 ^ uVar33) & uVar6 ^ uVar33) + uVar34 + uVar39 + -0x391ff40d;
      uVar5 = uVar5 + iVar4;
      uVar11 = ((uVar27 | uVar7) & uVar38 | uVar27 & uVar7) +
               ((uVar27 * 0x400 | uVar27 >> 0x16) ^
               (uVar27 * 0x80000 | uVar27 >> 0xd) ^ (uVar27 * 0x40000000 | uVar27 >> 2)) + iVar4;
      uVar34 = (uVar62 >> 3 ^
               (uVar64 << 0xe | uVar62 >> 0x12) ^ ((uVar40 >> 0x18) << 0x19 | uVar62 >> 7)) + uVar14
               + uVar47 +
               (uVar56 >> 10 ^
               (uVar56 * 0x2000 | uVar56 >> 0x13) ^ (uVar56 * 0x8000 | uVar56 >> 0x11));
      iVar4 = ((uVar5 * 0x80 | uVar5 >> 0x19) ^
              (uVar5 * 0x200000 | uVar5 >> 0xb) ^ (uVar5 * 0x4000000 | uVar5 >> 6)) +
              ((uVar6 ^ uVar10) & uVar5 ^ uVar10) + uVar33 + uVar34 + -0x2a586eb9;
      uVar38 = uVar38 + iVar4;
      uVar40 = ((uVar11 | uVar27) & uVar7 | uVar11 & uVar27) +
               ((uVar11 * 0x400 | uVar11 >> 0x16) ^
               (uVar11 * 0x80000 | uVar11 >> 0xd) ^ (uVar11 * 0x40000000 | uVar11 >> 2)) + iVar4;
      uVar45 = (uVar41 >> 3 ^
               (uVar2 << 0xe | uVar41 >> 0x12) ^ ((uVar46 >> 0x18) << 0x19 | uVar41 >> 7)) + uVar62
               + uVar17 +
               (uVar39 >> 10 ^
               (uVar39 * 0x2000 | uVar39 >> 0x13) ^ (uVar39 * 0x8000 | uVar39 >> 0x11));
      iVar4 = ((uVar5 ^ uVar6) & uVar38 ^ uVar6) + uVar10 + uVar45 +
              ((uVar38 * 0x80 | uVar38 >> 0x19) ^
              (uVar38 * 0x200000 | uVar38 >> 0xb) ^ (uVar38 * 0x4000000 | uVar38 >> 6)) + 0x6ca6351;
      uVar7 = uVar7 + iVar4;
      uVar46 = ((uVar40 | uVar11) & uVar27 | uVar40 & uVar11) +
               ((uVar40 * 0x400 | uVar40 >> 0x16) ^
               (uVar40 * 0x80000 | uVar40 >> 0xd) ^ (uVar40 * 0x40000000 | uVar40 >> 2)) + iVar4;
      uVar48 = (uVar15 >> 3 ^
               (uVar15 * 0x4000 | uVar15 >> 0x12) ^ (uVar15 * 0x2000000 | uVar15 >> 7)) + uVar41 +
               uVar29 + (uVar34 >> 10 ^
                        (uVar34 * 0x2000 | uVar34 >> 0x13) ^ (uVar34 * 0x8000 | uVar34 >> 0x11));
      iVar4 = ((uVar7 * 0x80 | uVar7 >> 0x19) ^
              (uVar7 * 0x200000 | uVar7 >> 0xb) ^ (uVar7 * 0x4000000 | uVar7 >> 6)) +
              ((uVar38 ^ uVar5) & uVar7 ^ uVar5) + uVar6 + uVar48 + 0x14292967;
      uVar27 = uVar27 + iVar4;
      uVar10 = ((uVar46 | uVar40) & uVar11 | uVar46 & uVar40) +
               ((uVar46 * 0x400 | uVar46 >> 0x16) ^
               (uVar46 * 0x80000 | uVar46 >> 0xd) ^ (uVar46 * 0x40000000 | uVar46 >> 2)) + iVar4;
      uVar52 = (uVar57 >> 3 ^
               (uVar57 * 0x4000 | uVar57 >> 0x12) ^ (uVar57 * 0x2000000 | uVar57 >> 7)) + uVar15 +
               uVar18 + (uVar45 >> 10 ^
                        (uVar45 * 0x2000 | uVar45 >> 0x13) ^ (uVar45 * 0x8000 | uVar45 >> 0x11));
      iVar4 = ((uVar7 ^ uVar38) & uVar27 ^ uVar38) + uVar5 + uVar52 +
              ((uVar27 * 0x80 | uVar27 >> 0x19) ^
              (uVar27 * 0x200000 | uVar27 >> 0xb) ^ (uVar27 * 0x4000000 | uVar27 >> 6)) + 0x27b70a85
      ;
      uVar11 = uVar11 + iVar4;
      uVar6 = ((uVar10 | uVar46) & uVar40 | uVar10 & uVar46) +
              ((uVar10 * 0x400 | uVar10 >> 0x16) ^
              (uVar10 * 0x80000 | uVar10 >> 0xd) ^ (uVar10 * 0x40000000 | uVar10 >> 2)) + iVar4;
      uVar49 = (uVar3 >> 3 ^ (uVar3 * 0x4000 | uVar3 >> 0x12) ^ (uVar3 * 0x2000000 | uVar3 >> 7)) +
               uVar57 + uVar55 +
               (uVar48 >> 10 ^
               (uVar48 * 0x2000 | uVar48 >> 0x13) ^ (uVar48 * 0x8000 | uVar48 >> 0x11));
      iVar4 = ((uVar11 * 0x80 | uVar11 >> 0x19) ^
              (uVar11 * 0x200000 | uVar11 >> 0xb) ^ (uVar11 * 0x4000000 | uVar11 >> 6)) +
              ((uVar27 ^ uVar7) & uVar11 ^ uVar7) + uVar38 + uVar49 + 0x2e1b2138;
      uVar40 = uVar40 + iVar4;
      uVar61 = ((uVar6 | uVar10) & uVar46 | uVar6 & uVar10) +
               ((uVar6 * 0x400 | uVar6 >> 0x16) ^
               (uVar6 * 0x80000 | uVar6 >> 0xd) ^ (uVar6 * 0x40000000 | uVar6 >> 2)) + iVar4;
      uVar5 = (uVar42 >> 3 ^ (uVar42 * 0x4000 | uVar42 >> 0x12) ^ (uVar42 * 0x2000000 | uVar42 >> 7)
              ) + uVar3 + uVar56 +
              (uVar52 >> 10 ^
              (uVar52 * 0x2000 | uVar52 >> 0x13) ^ (uVar52 * 0x8000 | uVar52 >> 0x11));
      iVar4 = ((uVar40 * 0x80 | uVar40 >> 0x19) ^
              (uVar40 * 0x200000 | uVar40 >> 0xb) ^ (uVar40 * 0x4000000 | uVar40 >> 6)) +
              ((uVar11 ^ uVar27) & uVar40 ^ uVar27) + uVar7 + uVar5 + 0x4d2c6dfc;
      uVar46 = uVar46 + iVar4;
      uVar30 = ((uVar61 | uVar6) & uVar10 | uVar61 & uVar6) +
               ((uVar61 * 0x400 | uVar61 >> 0x16) ^
               (uVar61 * 0x80000 | uVar61 >> 0xd) ^ (uVar61 * 0x40000000 | uVar61 >> 2)) + iVar4;
      uVar63 = (uVar31 >> 3 ^
               (uVar31 * 0x4000 | uVar31 >> 0x12) ^ (uVar31 * 0x2000000 | uVar31 >> 7)) + uVar42 +
               uVar39 + (uVar49 >> 10 ^
                        (uVar49 * 0x2000 | uVar49 >> 0x13) ^ (uVar49 * 0x8000 | uVar49 >> 0x11));
      iVar4 = ((uVar46 * 0x80 | uVar46 >> 0x19) ^
              (uVar46 * 0x200000 | uVar46 >> 0xb) ^ (uVar46 * 0x4000000 | uVar46 >> 6)) +
              ((uVar40 ^ uVar11) & uVar46 ^ uVar11) + uVar27 + uVar63 + 0x53380d13;
      uVar10 = uVar10 + iVar4;
      uVar37 = ((uVar30 | uVar61) & uVar6 | uVar30 & uVar61) +
               ((uVar30 * 0x400 | uVar30 >> 0x16) ^
               (uVar30 * 0x80000 | uVar30 >> 0xd) ^ (uVar30 * 0x40000000 | uVar30 >> 2)) + iVar4;
      uVar27 = (uVar43 >> 3 ^
               (uVar43 * 0x4000 | uVar43 >> 0x12) ^ (uVar43 * 0x2000000 | uVar43 >> 7)) + uVar31 +
               uVar34 + (uVar5 >> 10 ^
                        (uVar5 * 0x2000 | uVar5 >> 0x13) ^ (uVar5 * 0x8000 | uVar5 >> 0x11));
      iVar4 = ((uVar46 ^ uVar40) & uVar10 ^ uVar40) + uVar11 + uVar27 +
              ((uVar10 * 0x80 | uVar10 >> 0x19) ^
              (uVar10 * 0x200000 | uVar10 >> 0xb) ^ (uVar10 * 0x4000000 | uVar10 >> 6)) + 0x650a7354
      ;
      uVar6 = uVar6 + iVar4;
      uVar38 = ((uVar37 | uVar30) & uVar61 | uVar37 & uVar30) +
               ((uVar37 * 0x400 | uVar37 >> 0x16) ^
               (uVar37 * 0x80000 | uVar37 >> 0xd) ^ (uVar37 * 0x40000000 | uVar37 >> 2)) + iVar4;
      uVar64 = (uVar47 >> 3 ^
               (uVar47 * 0x4000 | uVar47 >> 0x12) ^ (uVar47 * 0x2000000 | uVar47 >> 7)) + uVar43 +
               uVar45 + (uVar63 >> 10 ^
                        (uVar63 * 0x2000 | uVar63 >> 0x13) ^ (uVar63 * 0x8000 | uVar63 >> 0x11));
      iVar4 = ((uVar6 * 0x80 | uVar6 >> 0x19) ^
              (uVar6 * 0x200000 | uVar6 >> 0xb) ^ (uVar6 * 0x4000000 | uVar6 >> 6)) +
              ((uVar10 ^ uVar46) & uVar6 ^ uVar46) + uVar40 + uVar64 + 0x766a0abb;
      uVar61 = uVar61 + iVar4;
      uVar15 = ((uVar38 | uVar37) & uVar30 | uVar38 & uVar37) +
               ((uVar38 * 0x400 | uVar38 >> 0x16) ^
               (uVar38 * 0x80000 | uVar38 >> 0xd) ^ (uVar38 * 0x40000000 | uVar38 >> 2)) + iVar4;
      uVar47 = (uVar17 >> 3 ^
               (uVar17 * 0x4000 | uVar17 >> 0x12) ^ (uVar17 * 0x2000000 | uVar17 >> 7)) + uVar47 +
               uVar48 + (uVar27 >> 10 ^
                        (uVar27 * 0x2000 | uVar27 >> 0x13) ^ (uVar27 * 0x8000 | uVar27 >> 0x11));
      iVar4 = ((uVar61 * 0x80 | uVar61 >> 0x19) ^
              (uVar61 * 0x200000 | uVar61 >> 0xb) ^ (uVar61 * 0x4000000 | uVar61 >> 6)) +
              ((uVar6 ^ uVar10) & uVar61 ^ uVar10) + uVar46 + uVar47 + -0x7e3d36d2;
      uVar30 = uVar30 + iVar4;
      uVar25 = ((uVar15 | uVar38) & uVar37 | uVar15 & uVar38) +
               ((uVar15 * 0x400 | uVar15 >> 0x16) ^
               (uVar15 * 0x80000 | uVar15 >> 0xd) ^ (uVar15 * 0x40000000 | uVar15 >> 2)) + iVar4;
      uVar59 = (uVar29 >> 3 ^
               (uVar29 * 0x4000 | uVar29 >> 0x12) ^ (uVar29 * 0x2000000 | uVar29 >> 7)) + uVar17 +
               uVar52 + (uVar64 >> 10 ^
                        (uVar64 * 0x2000 | uVar64 >> 0x13) ^ (uVar64 * 0x8000 | uVar64 >> 0x11));
      iVar4 = ((uVar30 * 0x80 | uVar30 >> 0x19) ^
              (uVar30 * 0x200000 | uVar30 >> 0xb) ^ (uVar30 * 0x4000000 | uVar30 >> 6)) +
              ((uVar61 ^ uVar6) & uVar30 ^ uVar6) + uVar10 + uVar59 + -0x6d8dd37b;
      uVar37 = uVar37 + iVar4;
      uVar43 = ((uVar25 | uVar15) & uVar38 | uVar25 & uVar15) +
               ((uVar25 * 0x400 | uVar25 >> 0x16) ^
               (uVar25 * 0x80000 | uVar25 >> 0xd) ^ (uVar25 * 0x40000000 | uVar25 >> 2)) + iVar4;
      uVar7 = (uVar18 >> 3 ^ (uVar18 * 0x4000 | uVar18 >> 0x12) ^ (uVar18 * 0x2000000 | uVar18 >> 7)
              ) + uVar29 + uVar49 +
              (uVar47 >> 10 ^
              (uVar47 * 0x2000 | uVar47 >> 0x13) ^ (uVar47 * 0x8000 | uVar47 >> 0x11));
      iVar4 = ((uVar37 * 0x80 | uVar37 >> 0x19) ^
              (uVar37 * 0x200000 | uVar37 >> 0xb) ^ (uVar37 * 0x4000000 | uVar37 >> 6)) +
              ((uVar30 ^ uVar61) & uVar37 ^ uVar61) + uVar6 + uVar7 + -0x5d40175f;
      uVar38 = uVar38 + iVar4;
      uVar29 = ((uVar43 | uVar25) & uVar15 | uVar43 & uVar25) +
               ((uVar43 * 0x400 | uVar43 >> 0x16) ^
               (uVar43 * 0x80000 | uVar43 >> 0xd) ^ (uVar43 * 0x40000000 | uVar43 >> 2)) + iVar4;
      uVar11 = (uVar55 >> 3 ^
               (uVar55 * 0x4000 | uVar55 >> 0x12) ^ (uVar55 * 0x2000000 | uVar55 >> 7)) + uVar18 +
               uVar5 + (uVar59 >> 10 ^
                       (uVar59 * 0x2000 | uVar59 >> 0x13) ^ (uVar59 * 0x8000 | uVar59 >> 0x11));
      iVar4 = ((uVar38 * 0x80 | uVar38 >> 0x19) ^
              (uVar38 * 0x200000 | uVar38 >> 0xb) ^ (uVar38 * 0x4000000 | uVar38 >> 6)) +
              ((uVar37 ^ uVar30) & uVar38 ^ uVar30) + uVar61 + uVar11 + -0x57e599b5;
      uVar15 = uVar15 + iVar4;
      uVar61 = ((uVar29 | uVar43) & uVar25 | uVar29 & uVar43) +
               ((uVar29 * 0x400 | uVar29 >> 0x16) ^
               (uVar29 * 0x80000 | uVar29 >> 0xd) ^ (uVar29 * 0x40000000 | uVar29 >> 2)) + iVar4;
      uVar46 = (uVar56 >> 3 ^
               (uVar56 * 0x4000 | uVar56 >> 0x12) ^ (uVar56 * 0x2000000 | uVar56 >> 7)) + uVar55 +
               uVar63 + (uVar7 >> 10 ^
                        (uVar7 * 0x2000 | uVar7 >> 0x13) ^ (uVar7 * 0x8000 | uVar7 >> 0x11));
      iVar4 = ((uVar15 * 0x80 | uVar15 >> 0x19) ^
              (uVar15 * 0x200000 | uVar15 >> 0xb) ^ (uVar15 * 0x4000000 | uVar15 >> 6)) +
              ((uVar38 ^ uVar37) & uVar15 ^ uVar37) + uVar30 + uVar46 + -0x3db47490;
      uVar25 = uVar25 + iVar4;
      uVar55 = ((uVar61 | uVar29) & uVar43 | uVar61 & uVar29) +
               ((uVar61 * 0x400 | uVar61 >> 0x16) ^
               (uVar61 * 0x80000 | uVar61 >> 0xd) ^ (uVar61 * 0x40000000 | uVar61 >> 2)) + iVar4;
      uVar30 = (uVar39 >> 3 ^
               (uVar39 * 0x4000 | uVar39 >> 0x12) ^ (uVar39 * 0x2000000 | uVar39 >> 7)) + uVar56 +
               uVar27 + (uVar11 >> 10 ^
                        (uVar11 * 0x2000 | uVar11 >> 0x13) ^ (uVar11 * 0x8000 | uVar11 >> 0x11));
      iVar4 = ((uVar25 * 0x80 | uVar25 >> 0x19) ^
              (uVar25 * 0x200000 | uVar25 >> 0xb) ^ (uVar25 * 0x4000000 | uVar25 >> 6)) +
              ((uVar15 ^ uVar38) & uVar25 ^ uVar38) + uVar37 + uVar30 + -0x3893ae5d;
      uVar43 = uVar43 + iVar4;
      uVar6 = ((uVar55 | uVar61) & uVar29 | uVar55 & uVar61) +
              ((uVar55 * 0x400 | uVar55 >> 0x16) ^
              (uVar55 * 0x80000 | uVar55 >> 0xd) ^ (uVar55 * 0x40000000 | uVar55 >> 2)) + iVar4;
      uVar40 = (uVar34 >> 3 ^
               (uVar34 * 0x4000 | uVar34 >> 0x12) ^ (uVar34 * 0x2000000 | uVar34 >> 7)) + uVar39 +
               uVar64 + (uVar46 >> 10 ^
                        (uVar46 * 0x2000 | uVar46 >> 0x13) ^ (uVar46 * 0x8000 | uVar46 >> 0x11));
      iVar4 = ((uVar43 * 0x80 | uVar43 >> 0x19) ^
              (uVar43 * 0x200000 | uVar43 >> 0xb) ^ (uVar43 * 0x4000000 | uVar43 >> 6)) +
              ((uVar25 ^ uVar15) & uVar43 ^ uVar15) + uVar38 + uVar40 + -0x2e6d17e7;
      uVar29 = uVar29 + iVar4;
      uVar42 = ((uVar6 | uVar55) & uVar61 | uVar6 & uVar55) +
               ((uVar6 * 0x400 | uVar6 >> 0x16) ^
               (uVar6 * 0x80000 | uVar6 >> 0xd) ^ (uVar6 * 0x40000000 | uVar6 >> 2)) + iVar4;
      uVar37 = (uVar45 >> 3 ^
               (uVar45 * 0x4000 | uVar45 >> 0x12) ^ (uVar45 * 0x2000000 | uVar45 >> 7)) + uVar34 +
               uVar47 + (uVar30 >> 10 ^
                        (uVar30 * 0x2000 | uVar30 >> 0x13) ^ (uVar30 * 0x8000 | uVar30 >> 0x11));
      iVar4 = ((uVar29 * 0x80 | uVar29 >> 0x19) ^
              (uVar29 * 0x200000 | uVar29 >> 0xb) ^ (uVar29 * 0x4000000 | uVar29 >> 6)) +
              ((uVar43 ^ uVar25) & uVar29 ^ uVar25) + uVar15 + uVar37 + -0x2966f9dc;
      uVar61 = uVar61 + iVar4;
      uVar15 = ((uVar42 | uVar6) & uVar55 | uVar42 & uVar6) +
               ((uVar42 * 0x400 | uVar42 >> 0x16) ^
               (uVar42 * 0x80000 | uVar42 >> 0xd) ^ (uVar42 * 0x40000000 | uVar42 >> 2)) + iVar4;
      uVar45 = (uVar48 >> 3 ^
               (uVar48 * 0x4000 | uVar48 >> 0x12) ^ (uVar48 * 0x2000000 | uVar48 >> 7)) + uVar45 +
               uVar59 + (uVar40 >> 10 ^
                        (uVar40 * 0x2000 | uVar40 >> 0x13) ^ (uVar40 * 0x8000 | uVar40 >> 0x11));
      iVar4 = ((uVar61 * 0x80 | uVar61 >> 0x19) ^
              (uVar61 * 0x200000 | uVar61 >> 0xb) ^ (uVar61 * 0x4000000 | uVar61 >> 6)) +
              ((uVar29 ^ uVar43) & uVar61 ^ uVar43) + uVar25 + uVar45 + -0xbf1ca7b;
      uVar55 = uVar55 + iVar4;
      uVar10 = ((uVar15 | uVar42) & uVar6 | uVar15 & uVar42) +
               ((uVar15 * 0x400 | uVar15 >> 0x16) ^
               (uVar15 * 0x80000 | uVar15 >> 0xd) ^ (uVar15 * 0x40000000 | uVar15 >> 2)) + iVar4;
      uVar38 = (uVar52 >> 3 ^
               (uVar52 * 0x4000 | uVar52 >> 0x12) ^ (uVar52 * 0x2000000 | uVar52 >> 7)) + uVar48 +
               uVar7 + (uVar37 >> 10 ^
                       (uVar37 * 0x2000 | uVar37 >> 0x13) ^ (uVar37 * 0x8000 | uVar37 >> 0x11));
      iVar4 = ((uVar55 * 0x80 | uVar55 >> 0x19) ^
              (uVar55 * 0x200000 | uVar55 >> 0xb) ^ (uVar55 * 0x4000000 | uVar55 >> 6)) +
              ((uVar61 ^ uVar29) & uVar55 ^ uVar29) + uVar43 + uVar38 + 0x106aa070;
      uVar6 = uVar6 + iVar4;
      uVar43 = ((uVar10 | uVar15) & uVar42 | uVar10 & uVar15) +
               ((uVar10 * 0x400 | uVar10 >> 0x16) ^
               (uVar10 * 0x80000 | uVar10 >> 0xd) ^ (uVar10 * 0x40000000 | uVar10 >> 2)) + iVar4;
      uVar56 = (uVar49 >> 3 ^
               (uVar49 * 0x4000 | uVar49 >> 0x12) ^ (uVar49 * 0x2000000 | uVar49 >> 7)) + uVar52 +
               uVar11 + (uVar45 >> 10 ^
                        (uVar45 * 0x2000 | uVar45 >> 0x13) ^ (uVar45 * 0x8000 | uVar45 >> 0x11));
      iVar4 = ((uVar6 * 0x80 | uVar6 >> 0x19) ^
              (uVar6 * 0x200000 | uVar6 >> 0xb) ^ (uVar6 * 0x4000000 | uVar6 >> 6)) +
              ((uVar55 ^ uVar61) & uVar6 ^ uVar61) + uVar29 + uVar56 + 0x19a4c116;
      uVar42 = uVar42 + iVar4;
      uVar25 = ((uVar43 | uVar10) & uVar15 | uVar43 & uVar10) +
               ((uVar43 * 0x400 | uVar43 >> 0x16) ^
               (uVar43 * 0x80000 | uVar43 >> 0xd) ^ (uVar43 * 0x40000000 | uVar43 >> 2)) + iVar4;
      uVar52 = (uVar5 >> 3 ^ (uVar5 * 0x4000 | uVar5 >> 0x12) ^ (uVar5 * 0x2000000 | uVar5 >> 7)) +
               uVar49 + uVar46 +
               (uVar38 >> 10 ^
               (uVar38 * 0x2000 | uVar38 >> 0x13) ^ (uVar38 * 0x8000 | uVar38 >> 0x11));
      iVar4 = ((uVar42 * 0x80 | uVar42 >> 0x19) ^
              (uVar42 * 0x200000 | uVar42 >> 0xb) ^ (uVar42 * 0x4000000 | uVar42 >> 6)) +
              ((uVar6 ^ uVar55) & uVar42 ^ uVar55) + uVar61 + uVar52 + 0x1e376c08;
      uVar15 = uVar15 + iVar4;
      uVar29 = ((uVar25 | uVar43) & uVar10 | uVar25 & uVar43) +
               ((uVar25 * 0x400 | uVar25 >> 0x16) ^
               (uVar25 * 0x80000 | uVar25 >> 0xd) ^ (uVar25 * 0x40000000 | uVar25 >> 2)) + iVar4;
      uVar61 = (uVar63 >> 3 ^
               (uVar63 * 0x4000 | uVar63 >> 0x12) ^ (uVar63 * 0x2000000 | uVar63 >> 7)) + uVar5 +
               uVar30 + (uVar56 >> 10 ^
                        (uVar56 * 0x2000 | uVar56 >> 0x13) ^ (uVar56 * 0x8000 | uVar56 >> 0x11));
      iVar4 = ((uVar15 * 0x80 | uVar15 >> 0x19) ^
              (uVar15 * 0x200000 | uVar15 >> 0xb) ^ (uVar15 * 0x4000000 | uVar15 >> 6)) +
              ((uVar42 ^ uVar6) & uVar15 ^ uVar6) + uVar55 + uVar61 + 0x2748774c;
      uVar10 = uVar10 + iVar4;
      uVar5 = ((uVar29 | uVar25) & uVar43 | uVar29 & uVar25) +
              ((uVar29 * 0x400 | uVar29 >> 0x16) ^
              (uVar29 * 0x80000 | uVar29 >> 0xd) ^ (uVar29 * 0x40000000 | uVar29 >> 2)) + iVar4;
      uVar48 = (uVar27 >> 3 ^
               (uVar27 * 0x4000 | uVar27 >> 0x12) ^ (uVar27 * 0x2000000 | uVar27 >> 7)) + uVar63 +
               uVar40 + (uVar52 >> 10 ^
                        (uVar52 * 0x2000 | uVar52 >> 0x13) ^ (uVar52 * 0x8000 | uVar52 >> 0x11));
      iVar4 = ((uVar10 * 0x80 | uVar10 >> 0x19) ^
              (uVar10 * 0x200000 | uVar10 >> 0xb) ^ (uVar10 * 0x4000000 | uVar10 >> 6)) +
              ((uVar15 ^ uVar42) & uVar10 ^ uVar42) + uVar6 + uVar48 + 0x34b0bcb5;
      uVar43 = uVar43 + iVar4;
      uVar39 = ((uVar5 | uVar29) & uVar25 | uVar5 & uVar29) +
               ((uVar5 * 0x400 | uVar5 >> 0x16) ^
               (uVar5 * 0x80000 | uVar5 >> 0xd) ^ (uVar5 * 0x40000000 | uVar5 >> 2)) + iVar4;
      uVar55 = (uVar64 >> 3 ^
               (uVar64 * 0x4000 | uVar64 >> 0x12) ^ (uVar64 * 0x2000000 | uVar64 >> 7)) + uVar27 +
               uVar37 + (uVar61 >> 10 ^
                        (uVar61 * 0x2000 | uVar61 >> 0x13) ^ (uVar61 * 0x8000 | uVar61 >> 0x11));
      iVar4 = ((uVar43 * 0x80 | uVar43 >> 0x19) ^
              (uVar43 * 0x200000 | uVar43 >> 0xb) ^ (uVar43 * 0x4000000 | uVar43 >> 6)) +
              ((uVar10 ^ uVar15) & uVar43 ^ uVar15) + uVar42 + uVar55 + 0x391c0cb3;
      uVar25 = uVar25 + iVar4;
      uVar34 = ((uVar39 | uVar5) & uVar29 | uVar39 & uVar5) +
               ((uVar39 * 0x400 | uVar39 >> 0x16) ^
               (uVar39 * 0x80000 | uVar39 >> 0xd) ^ (uVar39 * 0x40000000 | uVar39 >> 2)) + iVar4;
      uVar42 = (uVar47 >> 3 ^
               (uVar47 * 0x4000 | uVar47 >> 0x12) ^ (uVar47 * 0x2000000 | uVar47 >> 7)) + uVar64 +
               uVar45 + (uVar48 >> 10 ^
                        (uVar48 * 0x2000 | uVar48 >> 0x13) ^ (uVar48 * 0x8000 | uVar48 >> 0x11));
      iVar4 = ((uVar25 * 0x80 | uVar25 >> 0x19) ^
              (uVar25 * 0x200000 | uVar25 >> 0xb) ^ (uVar25 * 0x4000000 | uVar25 >> 6)) +
              ((uVar43 ^ uVar10) & uVar25 ^ uVar10) + uVar15 + uVar42 + 0x4ed8aa4a;
      uVar29 = uVar29 + iVar4;
      uVar49 = ((uVar34 | uVar39) & uVar5 | uVar34 & uVar39) +
               ((uVar34 * 0x400 | uVar34 >> 0x16) ^
               (uVar34 * 0x80000 | uVar34 >> 0xd) ^ (uVar34 * 0x40000000 | uVar34 >> 2)) + iVar4;
      uVar63 = (uVar59 >> 3 ^
               (uVar59 * 0x4000 | uVar59 >> 0x12) ^ (uVar59 * 0x2000000 | uVar59 >> 7)) + uVar47 +
               uVar38 + (uVar55 >> 10 ^
                        (uVar55 * 0x2000 | uVar55 >> 0x13) ^ (uVar55 * 0x8000 | uVar55 >> 0x11));
      iVar4 = ((uVar29 * 0x80 | uVar29 >> 0x19) ^
              (uVar29 * 0x200000 | uVar29 >> 0xb) ^ (uVar29 * 0x4000000 | uVar29 >> 6)) +
              ((uVar25 ^ uVar43) & uVar29 ^ uVar43) + uVar10 + uVar63 + 0x5b9cca4f;
      uVar5 = uVar5 + iVar4;
      uVar10 = ((uVar49 | uVar34) & uVar39 | uVar49 & uVar34) +
               ((uVar49 * 0x400 | uVar49 >> 0x16) ^
               (uVar49 * 0x80000 | uVar49 >> 0xd) ^ (uVar49 * 0x40000000 | uVar49 >> 2)) + iVar4;
      uVar47 = (uVar7 >> 3 ^ (uVar7 * 0x4000 | uVar7 >> 0x12) ^ (uVar7 * 0x2000000 | uVar7 >> 7)) +
               uVar59 + uVar56 +
               (uVar42 >> 10 ^
               (uVar42 * 0x2000 | uVar42 >> 0x13) ^ (uVar42 * 0x8000 | uVar42 >> 0x11));
      iVar4 = ((uVar5 * 0x80 | uVar5 >> 0x19) ^
              (uVar5 * 0x200000 | uVar5 >> 0xb) ^ (uVar5 * 0x4000000 | uVar5 >> 6)) +
              ((uVar29 ^ uVar25) & uVar5 ^ uVar25) + uVar43 + uVar47 + 0x682e6ff3;
      uVar39 = uVar39 + iVar4;
      uVar15 = ((uVar10 | uVar49) & uVar34 | uVar10 & uVar49) +
               ((uVar10 * 0x400 | uVar10 >> 0x16) ^
               (uVar10 * 0x80000 | uVar10 >> 0xd) ^ (uVar10 * 0x40000000 | uVar10 >> 2)) + iVar4;
      uVar43 = (uVar11 >> 3 ^
               (uVar11 * 0x4000 | uVar11 >> 0x12) ^ (uVar11 * 0x2000000 | uVar11 >> 7)) + uVar7 +
               uVar52 + (uVar63 >> 10 ^
                        (uVar63 * 0x2000 | uVar63 >> 0x13) ^ (uVar63 * 0x8000 | uVar63 >> 0x11));
      iVar4 = ((uVar5 ^ uVar29) & uVar39 ^ uVar29) + uVar25 + uVar43 +
              ((uVar39 * 0x80 | uVar39 >> 0x19) ^
              (uVar39 * 0x200000 | uVar39 >> 0xb) ^ (uVar39 * 0x4000000 | uVar39 >> 6)) + 0x748f82ee
      ;
      uVar34 = uVar34 + iVar4;
      uVar6 = ((uVar15 | uVar10) & uVar49 | uVar15 & uVar10) +
              ((uVar15 * 0x400 | uVar15 >> 0x16) ^
              (uVar15 * 0x80000 | uVar15 >> 0xd) ^ (uVar15 * 0x40000000 | uVar15 >> 2)) + iVar4;
      uVar27 = (uVar46 >> 3 ^
               (uVar46 * 0x4000 | uVar46 >> 0x12) ^ (uVar46 * 0x2000000 | uVar46 >> 7)) + uVar11 +
               uVar61 + (uVar47 >> 10 ^
                        (uVar47 * 0x2000 | uVar47 >> 0x13) ^ (uVar47 * 0x8000 | uVar47 >> 0x11));
      iVar4 = ((uVar34 * 0x80 | uVar34 >> 0x19) ^
              (uVar34 * 0x200000 | uVar34 >> 0xb) ^ (uVar34 * 0x4000000 | uVar34 >> 6)) +
              ((uVar39 ^ uVar5) & uVar34 ^ uVar5) + uVar29 + uVar27 + 0x78a5636f;
      uVar49 = uVar49 + iVar4;
      uVar29 = ((uVar6 | uVar15) & uVar10 | uVar6 & uVar15) +
               ((uVar6 * 0x400 | uVar6 >> 0x16) ^
               (uVar6 * 0x80000 | uVar6 >> 0xd) ^ (uVar6 * 0x40000000 | uVar6 >> 2)) + iVar4;
      uVar11 = (uVar30 >> 3 ^
               (uVar30 * 0x4000 | uVar30 >> 0x12) ^ (uVar30 * 0x2000000 | uVar30 >> 7)) + uVar46 +
               uVar48 + (uVar43 >> 10 ^
                        (uVar43 * 0x2000 | uVar43 >> 0x13) ^ (uVar43 * 0x8000 | uVar43 >> 0x11));
      iVar4 = ((uVar49 * 0x80 | uVar49 >> 0x19) ^
              (uVar49 * 0x200000 | uVar49 >> 0xb) ^ (uVar49 * 0x4000000 | uVar49 >> 6)) +
              ((uVar34 ^ uVar39) & uVar49 ^ uVar39) + uVar5 + uVar11 + -0x7b3787ec;
      uVar10 = uVar10 + iVar4;
      uVar52 = ((uVar29 | uVar6) & uVar15 | uVar29 & uVar6) +
               ((uVar29 * 0x400 | uVar29 >> 0x16) ^
               (uVar29 * 0x80000 | uVar29 >> 0xd) ^ (uVar29 * 0x40000000 | uVar29 >> 2)) + iVar4;
      uVar7 = (uVar40 >> 3 ^ (uVar40 * 0x4000 | uVar40 >> 0x12) ^ (uVar40 * 0x2000000 | uVar40 >> 7)
              ) + uVar30 + uVar55 +
              (uVar27 >> 10 ^
              (uVar27 * 0x2000 | uVar27 >> 0x13) ^ (uVar27 * 0x8000 | uVar27 >> 0x11));
      iVar4 = ((uVar10 * 0x80 | uVar10 >> 0x19) ^
              (uVar10 * 0x200000 | uVar10 >> 0xb) ^ (uVar10 * 0x4000000 | uVar10 >> 6)) +
              ((uVar49 ^ uVar34) & uVar10 ^ uVar34) + uVar39 + uVar7 + -0x7338fdf8;
      uVar15 = uVar15 + iVar4;
      uVar27 = ((uVar52 | uVar29) & uVar6 | uVar52 & uVar29) +
               ((uVar52 * 0x400 | uVar52 >> 0x16) ^
               (uVar52 * 0x80000 | uVar52 >> 0xd) ^ (uVar52 * 0x40000000 | uVar52 >> 2)) + iVar4;
      uVar11 = (uVar37 >> 3 ^
               (uVar37 * 0x4000 | uVar37 >> 0x12) ^ (uVar37 * 0x2000000 | uVar37 >> 7)) + uVar40 +
               uVar42 + (uVar11 >> 10 ^
                        (uVar11 * 0x2000 | uVar11 >> 0x13) ^ (uVar11 * 0x8000 | uVar11 >> 0x11));
      iVar4 = ((uVar15 * 0x80 | uVar15 >> 0x19) ^
              (uVar15 * 0x200000 | uVar15 >> 0xb) ^ (uVar15 * 0x4000000 | uVar15 >> 6)) +
              ((uVar10 ^ uVar49) & uVar15 ^ uVar49) + uVar34 + uVar11 + -0x6f410006;
      uVar6 = uVar6 + iVar4;
      uVar5 = ((uVar27 | uVar52) & uVar29 | uVar27 & uVar52) +
              ((uVar27 * 0x400 | uVar27 >> 0x16) ^
              (uVar27 * 0x80000 | uVar27 >> 0xd) ^ (uVar27 * 0x40000000 | uVar27 >> 2)) + iVar4;
      uVar7 = (uVar45 >> 3 ^ (uVar45 * 0x4000 | uVar45 >> 0x12) ^ (uVar45 * 0x2000000 | uVar45 >> 7)
              ) + uVar37 + uVar63 +
              (uVar7 >> 10 ^ (uVar7 * 0x2000 | uVar7 >> 0x13) ^ (uVar7 * 0x8000 | uVar7 >> 0x11));
      iVar4 = ((uVar6 * 0x80 | uVar6 >> 0x19) ^
              (uVar6 * 0x200000 | uVar6 >> 0xb) ^ (uVar6 * 0x4000000 | uVar6 >> 6)) +
              ((uVar15 ^ uVar10) & uVar6 ^ uVar10) + uVar49 + uVar7 + -0x5baf9315;
      uVar29 = uVar29 + iVar4;
      uVar39 = ((uVar5 | uVar27) & uVar52 | uVar5 & uVar27) +
               ((uVar5 * 0x400 | uVar5 >> 0x16) ^
               (uVar5 * 0x80000 | uVar5 >> 0xd) ^ (uVar5 * 0x40000000 | uVar5 >> 2)) + iVar4;
      iVar4 = ((uVar29 * 0x80 | uVar29 >> 0x19) ^
              (uVar29 * 0x200000 | uVar29 >> 0xb) ^ (uVar29 * 0x4000000 | uVar29 >> 6)) +
              (uVar38 >> 3 ^ (uVar38 * 0x4000 | uVar38 >> 0x12) ^ (uVar38 * 0x2000000 | uVar38 >> 7)
              ) + uVar45 + uVar47 +
              (uVar11 >> 10 ^
              (uVar11 * 0x2000 | uVar11 >> 0x13) ^ (uVar11 * 0x8000 | uVar11 >> 0x11)) + uVar10 +
              ((uVar6 ^ uVar15) & uVar29 ^ uVar15) + -0x41065c09;
      uVar52 = uVar52 + iVar4;
      uVar10 = ((uVar39 | uVar5) & uVar27 | uVar39 & uVar5) +
               ((uVar39 * 0x400 | uVar39 >> 0x16) ^
               (uVar39 * 0x80000 | uVar39 >> 0xd) ^ (uVar39 * 0x40000000 | uVar39 >> 2)) + iVar4;
      iVar4 = ((uVar52 * 0x80 | uVar52 >> 0x19) ^
              (uVar52 * 0x200000 | uVar52 >> 0xb) ^ (uVar52 * 0x4000000 | uVar52 >> 6)) +
              (uVar56 >> 3 ^ (uVar56 * 0x4000 | uVar56 >> 0x12) ^ (uVar56 * 0x2000000 | uVar56 >> 7)
              ) + uVar38 + uVar43 +
              (uVar7 >> 10 ^ (uVar7 * 0x2000 | uVar7 >> 0x13) ^ (uVar7 * 0x8000 | uVar7 >> 0x11)) +
              uVar15 + ((uVar29 ^ uVar6) & uVar52 ^ uVar6) + -0x398e870e;
      uVar9 = uVar10 + uVar9;
      uVar26 = uVar39 + uVar26;
      uVar50 = uVar5 + uVar50;
      uVar54 = ((uVar10 | uVar39) & uVar5 | uVar10 & uVar39) + uVar54 +
               ((uVar10 * 0x400 | uVar10 >> 0x16) ^
               (uVar10 * 0x80000 | uVar10 >> 0xd) ^ (uVar10 * 0x40000000 | uVar10 >> 2)) + iVar4;
      uVar24 = uVar27 + uVar24 + iVar4;
      uVar44 = uVar52 + uVar44;
      uVar16 = uVar29 + uVar16;
      uVar35 = uVar35 + uVar6;
      chunk = (uchar *)((long)chunk + 0x40);
      *s = uVar54;
      s[1] = uVar9;
      s[2] = uVar26;
      s[3] = uVar50;
      s[4] = uVar24;
      s[5] = uVar44;
      s[6] = uVar16;
      s[7] = uVar35;
      blocks = blocks - 1;
    } while (blocks != 0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Transform(uint32_t* s, const unsigned char* chunk, size_t blocks)
{
    while (blocks--) {
        uint32_t a = s[0], b = s[1], c = s[2], d = s[3], e = s[4], f = s[5], g = s[6], h = s[7];
        uint32_t w0, w1, w2, w3, w4, w5, w6, w7, w8, w9, w10, w11, w12, w13, w14, w15;

        Round(a, b, c, d, e, f, g, h, 0x428a2f98 + (w0 = ReadBE32(chunk + 0)));
        Round(h, a, b, c, d, e, f, g, 0x71374491 + (w1 = ReadBE32(chunk + 4)));
        Round(g, h, a, b, c, d, e, f, 0xb5c0fbcf + (w2 = ReadBE32(chunk + 8)));
        Round(f, g, h, a, b, c, d, e, 0xe9b5dba5 + (w3 = ReadBE32(chunk + 12)));
        Round(e, f, g, h, a, b, c, d, 0x3956c25b + (w4 = ReadBE32(chunk + 16)));
        Round(d, e, f, g, h, a, b, c, 0x59f111f1 + (w5 = ReadBE32(chunk + 20)));
        Round(c, d, e, f, g, h, a, b, 0x923f82a4 + (w6 = ReadBE32(chunk + 24)));
        Round(b, c, d, e, f, g, h, a, 0xab1c5ed5 + (w7 = ReadBE32(chunk + 28)));
        Round(a, b, c, d, e, f, g, h, 0xd807aa98 + (w8 = ReadBE32(chunk + 32)));
        Round(h, a, b, c, d, e, f, g, 0x12835b01 + (w9 = ReadBE32(chunk + 36)));
        Round(g, h, a, b, c, d, e, f, 0x243185be + (w10 = ReadBE32(chunk + 40)));
        Round(f, g, h, a, b, c, d, e, 0x550c7dc3 + (w11 = ReadBE32(chunk + 44)));
        Round(e, f, g, h, a, b, c, d, 0x72be5d74 + (w12 = ReadBE32(chunk + 48)));
        Round(d, e, f, g, h, a, b, c, 0x80deb1fe + (w13 = ReadBE32(chunk + 52)));
        Round(c, d, e, f, g, h, a, b, 0x9bdc06a7 + (w14 = ReadBE32(chunk + 56)));
        Round(b, c, d, e, f, g, h, a, 0xc19bf174 + (w15 = ReadBE32(chunk + 60)));

        Round(a, b, c, d, e, f, g, h, 0xe49b69c1 + (w0 += sigma1(w14) + w9 + sigma0(w1)));
        Round(h, a, b, c, d, e, f, g, 0xefbe4786 + (w1 += sigma1(w15) + w10 + sigma0(w2)));
        Round(g, h, a, b, c, d, e, f, 0x0fc19dc6 + (w2 += sigma1(w0) + w11 + sigma0(w3)));
        Round(f, g, h, a, b, c, d, e, 0x240ca1cc + (w3 += sigma1(w1) + w12 + sigma0(w4)));
        Round(e, f, g, h, a, b, c, d, 0x2de92c6f + (w4 += sigma1(w2) + w13 + sigma0(w5)));
        Round(d, e, f, g, h, a, b, c, 0x4a7484aa + (w5 += sigma1(w3) + w14 + sigma0(w6)));
        Round(c, d, e, f, g, h, a, b, 0x5cb0a9dc + (w6 += sigma1(w4) + w15 + sigma0(w7)));
        Round(b, c, d, e, f, g, h, a, 0x76f988da + (w7 += sigma1(w5) + w0 + sigma0(w8)));
        Round(a, b, c, d, e, f, g, h, 0x983e5152 + (w8 += sigma1(w6) + w1 + sigma0(w9)));
        Round(h, a, b, c, d, e, f, g, 0xa831c66d + (w9 += sigma1(w7) + w2 + sigma0(w10)));
        Round(g, h, a, b, c, d, e, f, 0xb00327c8 + (w10 += sigma1(w8) + w3 + sigma0(w11)));
        Round(f, g, h, a, b, c, d, e, 0xbf597fc7 + (w11 += sigma1(w9) + w4 + sigma0(w12)));
        Round(e, f, g, h, a, b, c, d, 0xc6e00bf3 + (w12 += sigma1(w10) + w5 + sigma0(w13)));
        Round(d, e, f, g, h, a, b, c, 0xd5a79147 + (w13 += sigma1(w11) + w6 + sigma0(w14)));
        Round(c, d, e, f, g, h, a, b, 0x06ca6351 + (w14 += sigma1(w12) + w7 + sigma0(w15)));
        Round(b, c, d, e, f, g, h, a, 0x14292967 + (w15 += sigma1(w13) + w8 + sigma0(w0)));

        Round(a, b, c, d, e, f, g, h, 0x27b70a85 + (w0 += sigma1(w14) + w9 + sigma0(w1)));
        Round(h, a, b, c, d, e, f, g, 0x2e1b2138 + (w1 += sigma1(w15) + w10 + sigma0(w2)));
        Round(g, h, a, b, c, d, e, f, 0x4d2c6dfc + (w2 += sigma1(w0) + w11 + sigma0(w3)));
        Round(f, g, h, a, b, c, d, e, 0x53380d13 + (w3 += sigma1(w1) + w12 + sigma0(w4)));
        Round(e, f, g, h, a, b, c, d, 0x650a7354 + (w4 += sigma1(w2) + w13 + sigma0(w5)));
        Round(d, e, f, g, h, a, b, c, 0x766a0abb + (w5 += sigma1(w3) + w14 + sigma0(w6)));
        Round(c, d, e, f, g, h, a, b, 0x81c2c92e + (w6 += sigma1(w4) + w15 + sigma0(w7)));
        Round(b, c, d, e, f, g, h, a, 0x92722c85 + (w7 += sigma1(w5) + w0 + sigma0(w8)));
        Round(a, b, c, d, e, f, g, h, 0xa2bfe8a1 + (w8 += sigma1(w6) + w1 + sigma0(w9)));
        Round(h, a, b, c, d, e, f, g, 0xa81a664b + (w9 += sigma1(w7) + w2 + sigma0(w10)));
        Round(g, h, a, b, c, d, e, f, 0xc24b8b70 + (w10 += sigma1(w8) + w3 + sigma0(w11)));
        Round(f, g, h, a, b, c, d, e, 0xc76c51a3 + (w11 += sigma1(w9) + w4 + sigma0(w12)));
        Round(e, f, g, h, a, b, c, d, 0xd192e819 + (w12 += sigma1(w10) + w5 + sigma0(w13)));
        Round(d, e, f, g, h, a, b, c, 0xd6990624 + (w13 += sigma1(w11) + w6 + sigma0(w14)));
        Round(c, d, e, f, g, h, a, b, 0xf40e3585 + (w14 += sigma1(w12) + w7 + sigma0(w15)));
        Round(b, c, d, e, f, g, h, a, 0x106aa070 + (w15 += sigma1(w13) + w8 + sigma0(w0)));

        Round(a, b, c, d, e, f, g, h, 0x19a4c116 + (w0 += sigma1(w14) + w9 + sigma0(w1)));
        Round(h, a, b, c, d, e, f, g, 0x1e376c08 + (w1 += sigma1(w15) + w10 + sigma0(w2)));
        Round(g, h, a, b, c, d, e, f, 0x2748774c + (w2 += sigma1(w0) + w11 + sigma0(w3)));
        Round(f, g, h, a, b, c, d, e, 0x34b0bcb5 + (w3 += sigma1(w1) + w12 + sigma0(w4)));
        Round(e, f, g, h, a, b, c, d, 0x391c0cb3 + (w4 += sigma1(w2) + w13 + sigma0(w5)));
        Round(d, e, f, g, h, a, b, c, 0x4ed8aa4a + (w5 += sigma1(w3) + w14 + sigma0(w6)));
        Round(c, d, e, f, g, h, a, b, 0x5b9cca4f + (w6 += sigma1(w4) + w15 + sigma0(w7)));
        Round(b, c, d, e, f, g, h, a, 0x682e6ff3 + (w7 += sigma1(w5) + w0 + sigma0(w8)));
        Round(a, b, c, d, e, f, g, h, 0x748f82ee + (w8 += sigma1(w6) + w1 + sigma0(w9)));
        Round(h, a, b, c, d, e, f, g, 0x78a5636f + (w9 += sigma1(w7) + w2 + sigma0(w10)));
        Round(g, h, a, b, c, d, e, f, 0x84c87814 + (w10 += sigma1(w8) + w3 + sigma0(w11)));
        Round(f, g, h, a, b, c, d, e, 0x8cc70208 + (w11 += sigma1(w9) + w4 + sigma0(w12)));
        Round(e, f, g, h, a, b, c, d, 0x90befffa + (w12 += sigma1(w10) + w5 + sigma0(w13)));
        Round(d, e, f, g, h, a, b, c, 0xa4506ceb + (w13 += sigma1(w11) + w6 + sigma0(w14)));
        Round(c, d, e, f, g, h, a, b, 0xbef9a3f7 + (w14 + sigma1(w12) + w7 + sigma0(w15)));
        Round(b, c, d, e, f, g, h, a, 0xc67178f2 + (w15 + sigma1(w13) + w8 + sigma0(w0)));

        s[0] += a;
        s[1] += b;
        s[2] += c;
        s[3] += d;
        s[4] += e;
        s[5] += f;
        s[6] += g;
        s[7] += h;
        chunk += 64;
    }
}